

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O2

void __thiscall CBinds::GetKeyID(CBinds *this,char *pBindStr,int *KeyID,int *Modifier)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int LocalKeyID;
  long lVar5;
  char (*paacVar6) [4] [128];
  char (*paacVar7) [4] [128];
  char (*a) [4] [128];
  
  *KeyID = 0x1da;
  *Modifier = 4;
  paacVar6 = this->m_aaaKeyBindings;
  lVar5 = 0;
  do {
    if (lVar5 == 0x1da) {
      return;
    }
    iVar1 = (int)lVar5;
    paacVar7 = paacVar6;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      a = (char (*) [4] [128])0x1d1174;
      if (iVar1 - 1U < 0x1d9) {
        a = paacVar7;
      }
      if ((*a)[0][0] != '\0') {
        iVar2 = str_comp((char *)a,pBindStr);
        if (iVar2 == 0) {
          *KeyID = iVar1;
          *Modifier = (int)lVar4;
          return;
        }
        pcVar3 = str_find((char *)a,pBindStr);
        if (pcVar3 != (char *)0x0) {
          *KeyID = iVar1;
          *Modifier = (int)lVar4;
        }
      }
      paacVar7 = (char (*) [4] [128])(*paacVar7 + 1);
    }
    lVar5 = lVar5 + 1;
    paacVar6 = paacVar6 + 1;
  } while( true );
}

Assistant:

void CBinds::GetKeyID(const char *pBindStr, int& KeyID, int& Modifier)
{
	KeyID = KEY_LAST;
	Modifier = MODIFIER_COUNT;

	for(int LocalKeyID = 0; LocalKeyID < KEY_LAST; LocalKeyID++)
	{
		for(int LocalModifier = 0; LocalModifier < MODIFIER_COUNT; LocalModifier++)
		{
			const char *pBind = Get(LocalKeyID, LocalModifier);
			if(!pBind[0])
				continue;

			if(str_comp(pBind, pBindStr) == 0)
			{
				KeyID = LocalKeyID;
				Modifier = LocalModifier;
				return;
			}
			if(str_find(pBind, pBindStr) != 0)
			{
				KeyID = LocalKeyID;
				Modifier = LocalModifier;
			}
		}
	}
}